

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedTransaction.cpp
# Opt level: O2

void __thiscall f8n::db::ScopedTransaction::End(ScopedTransaction *this)

{
  Connection *this_00;
  char *sql;
  
  this_00 = this->connection;
  this_00->transactionCounter = this_00->transactionCounter + -1;
  if (this_00->transactionCounter == 0) {
    sql = "COMMIT TRANSACTION";
    if (this->canceled != false) {
      sql = "ROLLBACK TRANSACTION";
    }
    Connection::Execute(this_00,sql);
  }
  this->canceled = false;
  return;
}

Assistant:

void ScopedTransaction::End() {
    --this->connection->transactionCounter;

    if (this->connection->transactionCounter == 0) {
        if (this->canceled) {
            this->connection->Execute("ROLLBACK TRANSACTION");
        }
        else {
            this->connection->Execute("COMMIT TRANSACTION");
            //this->connection->Checkpoint();
        }
    }

    this->canceled = false;
}